

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::Deserialize(Value *__return_storage_ptr__,Deserializer *deserializer)

{
  _Elt_pointer prVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  Value *pVVar4;
  undefined8 uVar5;
  element_type *peVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  undefined1 uVar9;
  int16_t iVar10;
  int iVar11;
  LogicalType *pLVar12;
  undefined4 extraout_var;
  int64_t iVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  NotImplementedException *this;
  InternalException *this_00;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  Value *pVVar14;
  long lVar15;
  idx_t index;
  CastParameters *in_R8;
  ExtraValueInfo *__tmp;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  interval_t iVar16;
  string_t str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  LogicalType type;
  Value val_1;
  undefined1 local_138 [40];
  LogicalType *local_110;
  deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
  *local_108;
  LogicalType local_100;
  Value local_e8;
  uint local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 local_9c;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  string local_80;
  LogicalType local_60;
  LogicalType local_48;
  undefined4 extraout_var_00;
  
  LogicalType::LogicalType(&local_48,INVALID);
  iVar11 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"type");
  if ((char)iVar11 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    LogicalType::LogicalType(&local_100,&local_48);
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    LogicalType::Deserialize(&local_100,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  LogicalType::~LogicalType(&local_48);
  if ((local_100.physical_type_ == INVALID) &&
     (pLVar12 = Deserializer::Get<duckdb::LogicalType_const&>(deserializer), &local_100 != pLVar12))
  {
    local_100.id_ = pLVar12->id_;
    local_100.physical_type_ = pLVar12->physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&local_100.type_info_,&pLVar12->type_info_);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"is_null");
  iVar11 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_110 = &local_100;
  LogicalType::LogicalType(&local_60,local_110);
  Value(__return_storage_ptr__,&local_60);
  LogicalType::~LogicalType(&local_60);
  if ((char)iVar11 != '\0') goto LAB_0130330a;
  __return_storage_ptr__->is_null = false;
  switch(local_100.physical_type_) {
  case BOOL:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar9 = (undefined1)iVar11;
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    goto LAB_013037d4;
  case UINT8:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    uVar9 = (undefined1)iVar11;
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    goto LAB_013037d4;
  case INT8:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0xe])(deserializer);
    uVar9 = (undefined1)iVar11;
    (*deserializer->_vptr_Deserializer[3])(deserializer);
LAB_013037d4:
    (__return_storage_ptr__->value_).boolean = (bool)uVar9;
    break;
  case UINT16:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0x11])(deserializer);
    iVar10 = (int16_t)iVar11;
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    goto LAB_0130384c;
  case INT16:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0x10])(deserializer);
    iVar10 = (int16_t)iVar11;
    (*deserializer->_vptr_Deserializer[3])(deserializer);
LAB_0130384c:
    (__return_storage_ptr__->value_).smallint = iVar10;
    break;
  case UINT32:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0x13])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    goto LAB_01303734;
  case INT32:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0x12])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
LAB_01303734:
    (__return_storage_ptr__->value_).integer = iVar11;
    break;
  case UINT64:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar13 = CONCAT44(extraout_var_01,iVar11);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    goto LAB_0130369f;
  case INT64:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    iVar11 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    iVar13 = CONCAT44(extraout_var_00,iVar11);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
LAB_0130369f:
    (__return_storage_ptr__->value_).bigint = iVar13;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_0130334a_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_e8.type_._0_8_ =
         &local_e8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Unimplemented type for Deserialize","");
    NotImplementedException::NotImplementedException(this,(string *)&local_e8);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[0x18])(deserializer);
    local_108 = (deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                 *)CONCAT44(local_108._4_4_,extraout_XMM0_Da_00);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (__return_storage_ptr__->value_).integer = (int32_t)local_108;
    break;
  case DOUBLE:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[0x19])(deserializer);
    local_108 = (deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                 *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    (__return_storage_ptr__->value_).bigint = (int64_t)local_108;
    break;
  case INTERVAL:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    iVar16 = interval_t::Deserialize(deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    goto LAB_013038b9;
  case LIST:
    pLVar12 = ListType::GetChildType(&local_100);
    prVar1 = (deserializer->data).types.c.
             super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (prVar1 == (deserializer->data).types.c.
                  super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
      ::_M_push_back_aux<duckdb::LogicalType_const&>
                ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                  *)&(deserializer->data).types,pLVar12);
    }
    else {
      prVar1->_M_data = pLVar12;
      (deserializer->data).types.c.
      super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
    }
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    (*deserializer->_vptr_Deserializer[2])(deserializer,100,"children");
    local_138._0_8_ = (Value *)0x0;
    local_138._8_8_ = (Value *)0x0;
    local_138._16_8_ = (pointer)0x0;
    iVar11 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    lVar15 = CONCAT44(extraout_var_05,iVar11);
    if (lVar15 != 0) {
      do {
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        Deserialize(&local_e8,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_138,&local_e8);
        ~Value(&local_e8);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    local_e8.type_._0_8_ = (NestedValueInfo *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::NestedValueInfo,std::allocator<duckdb::NestedValueInfo>,duckdb::vector<duckdb::Value,true>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.type_.type_info_,
               (NestedValueInfo **)&local_e8,(allocator<duckdb::NestedValueInfo> *)&local_80,
               (vector<duckdb::Value,_true> *)local_138);
    peVar6 = local_e8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = local_e8.type_._0_8_;
    if (local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_e8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 type =
             *(int *)&(local_e8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
        UNLOCK();
        if (local_e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) goto LAB_01303b9f;
      }
      else {
        *(int *)&(local_e8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 type =
             *(int *)&(local_e8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
LAB_01303b9f:
    (__return_storage_ptr__->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    p_Var2 = (__return_storage_ptr__->value_info_).internal.
             super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (__return_storage_ptr__->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
    pVVar14 = (Value *)local_138._0_8_;
    pVVar4 = (Value *)local_138._8_8_;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      pVVar14 = (Value *)local_138._0_8_;
      pVVar4 = (Value *)local_138._8_8_;
    }
    for (; uVar5 = local_138._8_8_, bVar3 = pVVar14 != (Value *)local_138._8_8_,
        local_138._8_8_ = pVVar4, bVar3; pVVar14 = pVVar14 + 1) {
      ~Value(pVVar14);
      pVVar4 = (Value *)local_138._8_8_;
      local_138._8_8_ = uVar5;
    }
    goto LAB_01303bdd;
  case STRUCT:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    local_138._0_8_ = (Value *)0x0;
    local_138._8_8_ = (Value *)0x0;
    local_138._16_8_ = (pointer)0x0;
    (*deserializer->_vptr_Deserializer[2])(deserializer,100,"children");
    iVar11 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    if (CONCAT44(extraout_var,iVar11) != 0) {
      local_108 = (deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                   *)&(deserializer->data).types;
      index = 0;
      do {
        pLVar12 = StructType::GetChildType(&local_100,index);
        prVar1 = (deserializer->data).types.c.
                 super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (prVar1 == (deserializer->data).types.c.
                      super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          ::std::
          deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
          ::_M_push_back_aux<duckdb::LogicalType_const&>(local_108,pLVar12);
        }
        else {
          prVar1->_M_data = pLVar12;
          (deserializer->data).types.c.
          super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
        }
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        Deserialize(&local_e8,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        Deserializer::Unset<duckdb::LogicalType>(deserializer);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_138,&local_e8);
        ~Value(&local_e8);
        index = index + 1;
      } while (CONCAT44(extraout_var,iVar11) != index);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    local_e8.type_._0_8_ = (NestedValueInfo *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::NestedValueInfo,std::allocator<duckdb::NestedValueInfo>,duckdb::vector<duckdb::Value,true>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.type_.type_info_,
               (NestedValueInfo **)&local_e8,(allocator<duckdb::NestedValueInfo> *)&local_80,
               (vector<duckdb::Value,_true> *)local_138);
    peVar6 = local_e8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = local_e8.type_._0_8_;
    if (local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_e8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 type =
             *(int *)&(local_e8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
        UNLOCK();
        if (local_e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) goto LAB_01303c1c;
      }
      else {
        *(int *)&(local_e8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 type =
             *(int *)&(local_e8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
LAB_01303c1c:
    (__return_storage_ptr__->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    p_Var2 = (__return_storage_ptr__->value_info_).internal.
             super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (__return_storage_ptr__->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
    pVVar14 = (Value *)local_138._0_8_;
    pVVar4 = (Value *)local_138._8_8_;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      pVVar14 = (Value *)local_138._0_8_;
      pVVar4 = (Value *)local_138._8_8_;
    }
    for (; uVar5 = local_138._8_8_, pVVar14 != (Value *)local_138._8_8_; pVVar14 = pVVar14 + 1) {
      local_138._8_8_ = pVVar4;
      ~Value(pVVar14);
      pVVar4 = (Value *)local_138._8_8_;
      local_138._8_8_ = uVar5;
    }
    local_138._8_8_ = pVVar4;
    if ((Value *)local_138._0_8_ != (Value *)0x0) {
      operator_delete((void *)local_138._0_8_);
    }
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    break;
  case ARRAY:
    pLVar12 = ArrayType::GetChildType(&local_100);
    prVar1 = (deserializer->data).types.c.
             super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (prVar1 == (deserializer->data).types.c.
                  super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
      ::_M_push_back_aux<duckdb::LogicalType_const&>
                ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                  *)&(deserializer->data).types,pLVar12);
    }
    else {
      prVar1->_M_data = pLVar12;
      (deserializer->data).types.c.
      super__Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur = prVar1 + 1;
    }
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    (*deserializer->_vptr_Deserializer[2])(deserializer,100,"children");
    local_138._0_8_ = (Value *)0x0;
    local_138._8_8_ = (Value *)0x0;
    local_138._16_8_ = (pointer)0x0;
    iVar11 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    lVar15 = CONCAT44(extraout_var_04,iVar11);
    if (lVar15 != 0) {
      do {
        (*deserializer->_vptr_Deserializer[6])(deserializer);
        Deserialize(&local_e8,deserializer);
        (*deserializer->_vptr_Deserializer[7])(deserializer);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_138,&local_e8);
        ~Value(&local_e8);
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    local_e8.type_._0_8_ = (NestedValueInfo *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::NestedValueInfo,std::allocator<duckdb::NestedValueInfo>,duckdb::vector<duckdb::Value,true>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.type_.type_info_,
               (NestedValueInfo **)&local_e8,(allocator<duckdb::NestedValueInfo> *)&local_80,
               (vector<duckdb::Value,_true> *)local_138);
    peVar6 = local_e8.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = local_e8.type_._0_8_;
    if (local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_e8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 type =
             *(int *)&(local_e8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
        UNLOCK();
        if (local_e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) goto LAB_01303b51;
      }
      else {
        *(int *)&(local_e8.type_.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 type =
             *(int *)&(local_e8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->type + 1;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
LAB_01303b51:
    (__return_storage_ptr__->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    p_Var2 = (__return_storage_ptr__->value_info_).internal.
             super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (__return_storage_ptr__->value_info_).internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
    pVVar14 = (Value *)local_138._0_8_;
    pVVar4 = (Value *)local_138._8_8_;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      pVVar14 = (Value *)local_138._0_8_;
      pVVar4 = (Value *)local_138._8_8_;
    }
    for (; uVar5 = local_138._8_8_, bVar3 = pVVar14 != (Value *)local_138._8_8_,
        local_138._8_8_ = pVVar4, bVar3; pVVar14 = pVVar14 + 1) {
      ~Value(pVVar14);
      pVVar4 = (Value *)local_138._8_8_;
      local_138._8_8_ = uVar5;
    }
LAB_01303bdd:
    if ((Value *)local_138._0_8_ != (Value *)0x0) {
      operator_delete((void *)local_138._0_8_);
    }
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    Deserializer::Unset<duckdb::LogicalType>(deserializer);
    break;
  default:
    switch(local_100.physical_type_) {
    case VARCHAR:
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
      (*deserializer->_vptr_Deserializer[0x1a])(local_138,deserializer);
      (*deserializer->_vptr_Deserializer[3])(deserializer);
      if (local_100.id_ == BLOB) {
        local_a8 = (uint)local_138._8_8_;
        if (local_a8 < 0xd) {
          local_9c = 0;
          uStack_a4 = 0;
          uStack_a0 = 0;
          if (local_a8 == 0) {
            pVVar14 = (Value *)0x0;
          }
          else {
            switchD_012b9b0d::default(&uStack_a4,(void *)local_138._0_8_,(ulong)(local_a8 & 0xf));
            pVVar14 = (Value *)CONCAT44(local_9c,uStack_a0);
          }
        }
        else {
          uStack_a4 = *(undefined4 *)local_138._0_8_;
          pVVar14 = (Value *)local_138._0_8_;
        }
        local_e8.type_._0_8_ = (NestedValueInfo *)0x0;
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((ulong)local_e8.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
             0xffffffffffffff00);
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8.is_null = false;
        local_e8._25_7_ = 0;
        local_e8.value_.bigint = -1;
        local_e8.value_.hugeint.upper._0_1_ = 0;
        str_00.value.pointer.ptr = (char *)&local_e8;
        str_00.value._0_8_ = pVVar14;
        Blob::ToBlob_abi_cxx11_(&local_80,(Blob *)CONCAT44(uStack_a4,local_a8),str_00,in_R8);
        make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string>((duckdb *)&local_98,&local_80)
        ;
        p_Var8 = p_Stack_90;
        peVar7 = local_98;
        local_98 = (element_type *)0x0;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = (__return_storage_ptr__->value_info_).internal.
                 super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->value_info_).internal.
        super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
        (__return_storage_ptr__->value_info_).internal.
        super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var8;
        if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
           p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      else {
        make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string&>
                  ((duckdb *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
        peVar6 = local_e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar5 = local_e8.type_._0_8_;
        local_e8.type_._0_8_ = (NestedValueInfo *)0x0;
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        p_Var2 = (__return_storage_ptr__->value_info_).internal.
                 super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (__return_storage_ptr__->value_info_).internal.
        super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar5;
        (__return_storage_ptr__->value_info_).internal.
        super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
        if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
           local_e8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0)) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if ((Value *)local_138._0_8_ != (Value *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
      goto LAB_0130330a;
    default:
      goto switchD_0130334a_caseD_a;
    case UINT128:
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
      iVar11 = (*deserializer->_vptr_Deserializer[0x17])(deserializer);
      iVar16.days = extraout_var_03;
      iVar16.months = iVar11;
      iVar16.micros = extraout_RDX_00;
      (*deserializer->_vptr_Deserializer[3])(deserializer);
      break;
    case INT128:
      (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
      iVar11 = (*deserializer->_vptr_Deserializer[0x16])(deserializer);
      iVar16.days = extraout_var_02;
      iVar16.months = iVar11;
      iVar16.micros = extraout_RDX;
      (*deserializer->_vptr_Deserializer[3])(deserializer);
      break;
    case BIT:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_e8.type_._0_8_ =
           &local_e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"BIT type should not be deserialized","");
      InternalException::InternalException(this_00,(string *)&local_e8);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_013038b9:
    (__return_storage_ptr__->value_).interval = iVar16;
  }
LAB_0130330a:
  LogicalType::~LogicalType(&local_100);
  return __return_storage_ptr__;
}

Assistant:

Value Value::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadPropertyWithExplicitDefault<LogicalType>(100, "type", LogicalTypeId::INVALID);
	if (type.InternalType() == PhysicalType::INVALID) {
		type = deserializer.Get<const LogicalType &>();
	}
	auto is_null = deserializer.ReadProperty<bool>(101, "is_null");
	Value new_value = Value(type);
	if (is_null) {
		return new_value;
	}
	new_value.is_null = false;
	switch (type.InternalType()) {
	case PhysicalType::BIT:
		throw InternalException("BIT type should not be deserialized");
	case PhysicalType::BOOL:
		new_value.value_.boolean = deserializer.ReadProperty<bool>(102, "value");
		break;
	case PhysicalType::UINT8:
		new_value.value_.utinyint = deserializer.ReadProperty<uint8_t>(102, "value");
		break;
	case PhysicalType::INT8:
		new_value.value_.tinyint = deserializer.ReadProperty<int8_t>(102, "value");
		break;
	case PhysicalType::UINT16:
		new_value.value_.usmallint = deserializer.ReadProperty<uint16_t>(102, "value");
		break;
	case PhysicalType::INT16:
		new_value.value_.smallint = deserializer.ReadProperty<int16_t>(102, "value");
		break;
	case PhysicalType::UINT32:
		new_value.value_.uinteger = deserializer.ReadProperty<uint32_t>(102, "value");
		break;
	case PhysicalType::INT32:
		new_value.value_.integer = deserializer.ReadProperty<int32_t>(102, "value");
		break;
	case PhysicalType::UINT64:
		new_value.value_.ubigint = deserializer.ReadProperty<uint64_t>(102, "value");
		break;
	case PhysicalType::INT64:
		new_value.value_.bigint = deserializer.ReadProperty<int64_t>(102, "value");
		break;
	case PhysicalType::UINT128:
		new_value.value_.uhugeint = deserializer.ReadProperty<uhugeint_t>(102, "value");
		break;
	case PhysicalType::INT128:
		new_value.value_.hugeint = deserializer.ReadProperty<hugeint_t>(102, "value");
		break;
	case PhysicalType::FLOAT:
		new_value.value_.float_ = deserializer.ReadProperty<float>(102, "value");
		break;
	case PhysicalType::DOUBLE:
		new_value.value_.double_ = deserializer.ReadProperty<double>(102, "value");
		break;
	case PhysicalType::INTERVAL:
		new_value.value_.interval = deserializer.ReadProperty<interval_t>(102, "value");
		break;
	case PhysicalType::VARCHAR: {
		auto str = deserializer.ReadProperty<string>(102, "value");
		if (type.id() == LogicalTypeId::BLOB) {
			new_value.value_info_ = make_shared_ptr<StringValueInfo>(Blob::ToBlob(str));
		} else {
			new_value.value_info_ = make_shared_ptr<StringValueInfo>(str);
		}
	} break;
	case PhysicalType::LIST: {
		deserializer.Set<const LogicalType &>(ListType::GetChildType(type));
		deserializer.ReadObject(102, "value", [&](Deserializer &obj) {
			auto children = obj.ReadProperty<vector<Value>>(100, "children");
			new_value.value_info_ = make_shared_ptr<NestedValueInfo>(children);
		});
		deserializer.Unset<LogicalType>();
	} break;
	case PhysicalType::STRUCT: {
		deserializer.ReadObject(102, "value", [&](Deserializer &obj) {
			vector<Value> children;
			obj.ReadList(100, "children", [&](Deserializer::List &list, idx_t i) {
				deserializer.Set<const LogicalType &>(StructType::GetChildType(type, i));
				auto child = list.ReadElement<Value>();
				deserializer.Unset<LogicalType>();
				children.push_back(std::move(child));
			});
			new_value.value_info_ = make_shared_ptr<NestedValueInfo>(children);
		});
	} break;
	case PhysicalType::ARRAY: {
		deserializer.Set<const LogicalType &>(ArrayType::GetChildType(type));
		deserializer.ReadObject(102, "value", [&](Deserializer &obj) {
			auto children = obj.ReadProperty<vector<Value>>(100, "children");
			new_value.value_info_ = make_shared_ptr<NestedValueInfo>(children);
		});
		deserializer.Unset<LogicalType>();
	} break;
	default:
		throw NotImplementedException("Unimplemented type for Deserialize");
	}
	return new_value;
}